

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::FileDescriptorProto::SerializeWithCachedSizesToArray
          (FileDescriptorProto *this,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string *psVar1;
  char *data;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint uVar3;
  int32 iVar4;
  uint8 *puVar5;
  Type *pTVar6;
  Type *this_01;
  Type *this_02;
  Type *this_03;
  Type *this_04;
  int i;
  int iVar7;
  FileOptions *this_05;
  SourceCodeInfo *this_06;
  
  uVar3 = this->_has_bits_[0];
  if ((uVar3 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar1 = this->name_;
    *target = '\n';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar1->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar1,puVar5);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->package_->_M_dataplus)._M_p,(int)this->package_->_M_string_length,SERIALIZE);
    psVar1 = this->package_;
    *target = '\x12';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar1->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar1,puVar5);
  }
  this_00 = &this->dependency_;
  for (iVar7 = 0; iVar7 < (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
      iVar7 = iVar7 + 1) {
    pTVar6 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar7);
    data = (pTVar6->_M_dataplus)._M_p;
    pTVar6 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar7);
    internal::WireFormat::VerifyUTF8StringFallback(data,(int)pTVar6->_M_string_length,SERIALIZE);
    pTVar6 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar7);
    *target = '\x1a';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)pTVar6->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(pTVar6,puVar5);
  }
  for (iVar7 = 0; iVar7 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar7 = iVar7 + 1) {
    this_01 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                        (&(this->message_type_).super_RepeatedPtrFieldBase,iVar7);
    *target = '\"';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(this_01->_cached_size_,target + 1);
    target = DescriptorProto::SerializeWithCachedSizesToArray(this_01,puVar5);
  }
  for (iVar7 = 0; iVar7 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar7 = iVar7 + 1) {
    this_02 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar7);
    *target = '*';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(this_02->_cached_size_,target + 1);
    target = EnumDescriptorProto::SerializeWithCachedSizesToArray(this_02,puVar5);
  }
  for (iVar7 = 0; iVar7 < (this->service_).super_RepeatedPtrFieldBase.current_size_;
      iVar7 = iVar7 + 1) {
    this_03 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                        (&(this->service_).super_RepeatedPtrFieldBase,iVar7);
    *target = '2';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(this_03->_cached_size_,target + 1);
    target = ServiceDescriptorProto::SerializeWithCachedSizesToArray(this_03,puVar5);
  }
  for (iVar7 = 0; iVar7 < (this->extension_).super_RepeatedPtrFieldBase.current_size_;
      iVar7 = iVar7 + 1) {
    this_04 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                        (&(this->extension_).super_RepeatedPtrFieldBase,iVar7);
    *target = ':';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(this_04->_cached_size_,target + 1);
    target = FieldDescriptorProto::SerializeWithCachedSizesToArray(this_04,puVar5);
  }
  uVar3 = this->_has_bits_[0];
  if ((uVar3 >> 9 & 1) != 0) {
    this_05 = this->options_;
    if (this_05 == (FileOptions *)0x0) {
      this_05 = *(FileOptions **)(default_instance_ + 0xb8);
    }
    *target = 'B';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(this_05->_cached_size_,target + 1);
    target = FileOptions::SerializeWithCachedSizesToArray(this_05,puVar5);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 >> 10 & 1) != 0) {
    this_06 = this->source_code_info_;
    if (this_06 == (SourceCodeInfo *)0x0) {
      this_06 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
    }
    *target = 'J';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(this_06->_cached_size_,target + 1);
    target = SourceCodeInfo::SerializeWithCachedSizesToArray(this_06,puVar5);
  }
  for (iVar7 = 0; iVar7 < (this->public_dependency_).current_size_; iVar7 = iVar7 + 1) {
    iVar4 = public_dependency(this,iVar7);
    *target = 'P';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar4,target + 1);
  }
  for (iVar7 = 0; iVar7 < (this->weak_dependency_).current_size_; iVar7 = iVar7 + 1) {
    iVar4 = weak_dependency(this,iVar7);
    *target = 'X';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar4,target + 1);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar5 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FileDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string package = 2;
  if (has_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0; i < this->dependency_size(); i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->dependency(i).data(), this->dependency(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->dependency(i), target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (int i = 0; i < this->message_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        4, this->message_type(i), target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (int i = 0; i < this->enum_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        5, this->enum_type(i), target);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (int i = 0; i < this->service_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        6, this->service(i), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (int i = 0; i < this->extension_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        7, this->extension(i), target);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        8, this->options(), target);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (has_source_code_info()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        9, this->source_code_info(), target);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0; i < this->public_dependency_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32ToArray(10, this->public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0; i < this->weak_dependency_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32ToArray(11, this->weak_dependency(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}